

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_linal_mat2rpy(double *rpy,double *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = R[2];
  dVar1 = R[5] * R[5] + R[8] * R[8];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = atan2(dVar2,dVar1);
  rpy[1] = dVar2;
  if (ABS(R[2]) < 0.5) {
    dVar2 = atan2(R[8],R[5]);
    *rpy = -dVar2;
    dVar2 = atan2(*R,R[1]);
    goto LAB_00108a4f;
  }
  dVar1 = atan2(R[3] - R[7],R[6] + R[4]);
  dVar3 = atan2(R[3] + R[7],R[6] - R[4]);
  dVar4 = -dVar3;
  dVar2 = *R;
  if (((0.0 < dVar2) || (R[8] < 0.0)) || (dVar1 <= 0.0)) {
    if (((dVar2 < 0.0) || (0.0 < R[8])) || (0.0 <= dVar1)) {
      if (((0.0 < dVar2) || (0.0 < R[8])) || (0.0 <= dVar3)) {
        if (((dVar2 < 0.0) || (R[8] < 0.0)) || (dVar3 <= 0.0)) goto LAB_00108a2f;
        dVar4 = 6.283185307179586;
      }
      else {
        dVar4 = -6.283185307179586;
      }
      dVar4 = dVar4 - dVar3;
    }
    else {
      dVar1 = dVar1 + 6.283185307179586;
    }
  }
  else {
    dVar1 = dVar1 + -6.283185307179586;
  }
LAB_00108a2f:
  *rpy = (dVar1 - dVar4) * 0.5;
  dVar2 = (dVar1 + dVar4) * 0.5;
LAB_00108a4f:
  rpy[2] = dVar2;
  return;
}

Assistant:

void fsnav_linal_mat2rpy(double* rpy, double* R)
{
	const double pi2 = 6.283185307179586476925286766559005768; // pi*2, IEEE-754 quadruple precision
	double dp, dm;

	rpy[1] = atan2(R[2], sqrt(R[5]*R[5] + R[8]*R[8])); // pitch angle

	if (fabs(R[2]) < 0.5) {          // pitch magnitude below 30 deg
		rpy[0] = -atan2(R[8], R[5]); // roll angle
		rpy[2] =  atan2(R[0], R[1]); // yaw  angle
	}
	else {                           // pitch magnitude over 30 deg
		dp =  atan2(R[3]-R[7], R[6]+R[4]);
		dm = -atan2(R[3]+R[7], R[6]-R[4]);

		if (R[0] <= 0 && -R[8] <= 0 && dp > 0)      dp -= pi2;
		else if (R[0] >= 0 && -R[8] >= 0 && dp < 0) dp += pi2;
		else if (R[0] <= 0 && -R[8] >= 0 && dm > 0) dm -= pi2;
		else if (R[0] >= 0 && -R[8] <= 0 && dm < 0) dm += pi2;

		rpy[0] = (dp - dm)/2; // roll angle
		rpy[2] = (dp + dm)/2; // yaw  angle
	}
}